

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O0

void ProjectOrigin(btVector3 *a,btVector3 *b,btVector3 *prj,btScalar *sqd)

{
  float *in_RCX;
  undefined8 *in_RDX;
  btScalar bVar1;
  btVector3 bVar2;
  btScalar l2;
  btVector3 p;
  btScalar t;
  btScalar m2;
  btVector3 d;
  btVector3 *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  btVector3 local_30;
  float *local_20;
  undefined8 *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  bVar2 = operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (btVector3 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_30.m_floats._0_8_ = bVar2.m_floats._0_8_;
  local_30.m_floats._8_8_ = bVar2.m_floats._8_8_;
  local_34 = btVector3::length2((btVector3 *)0x28150d);
  if (1.1920929e-07 < local_34) {
    bVar1 = btDot(in_stack_ffffffffffffff90,&local_30);
    local_3c = -bVar1 / local_34;
    local_40 = 0.0;
    local_44 = 1.0;
    local_38 = Clamp<float>(&local_3c,&local_40,&local_44);
    bVar2 = operator*((btVector3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      (btScalar *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    bVar2 = operator+(bVar2.m_floats._4_8_,
                      (btVector3 *)CONCAT44(bVar2.m_floats[0],in_stack_ffffffffffffff98));
    bVar1 = btVector3::length2((btVector3 *)0x2815cb);
    if (bVar1 < *local_20) {
      *local_18 = bVar2.m_floats._0_8_;
      local_18[1] = bVar2.m_floats._8_8_;
      *local_20 = bVar1;
    }
  }
  return;
}

Assistant:

static inline void			ProjectOrigin(	const btVector3& a,
										  const btVector3& b,
										  btVector3& prj,
										  btScalar& sqd)
{
	const btVector3	d=b-a;
	const btScalar	m2=d.length2();
	if(m2>SIMD_EPSILON)
	{	
		const btScalar	t=Clamp<btScalar>(-btDot(a,d)/m2,0,1);
		const btVector3	p=a+d*t;
		const btScalar	l2=p.length2();
		if(l2<sqd)
		{
			prj=p;
			sqd=l2;
		}
	}
}